

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::ContentEncoding::ParseCompressionEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentCompression *compression)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  unsigned_long_long uVar5;
  uchar *puVar6;
  longlong *id_00;
  long unaff_RBX;
  long stop;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_50;
  ulong local_48;
  long local_40;
  undefined8 local_38;
  
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x10d3,
                  "long mkvparser::ContentEncoding::ParseCompressionEntry(long long, long long, IMkvReader *, ContentCompression *)"
                 );
  }
  if (compression == (ContentCompression *)0x0) {
    __assert_fail("compression",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x10d4,
                  "long mkvparser::ContentEncoding::ParseCompressionEntry(long long, long long, IMkvReader *, ContentCompression *)"
                 );
  }
  stop = size + start;
  local_38 = 0;
  local_50 = start;
  do {
    id_00 = &local_40;
    if (stop <= local_50) {
      return (ulong)((byte)local_38 & 1) * 2 + -2;
    }
    lVar4 = ParseElementHeader(pReader,&local_50,stop,id_00,(longlong *)&local_48);
    uVar2 = local_48;
    if (lVar4 < 0) {
      bVar1 = false;
      unaff_RBX = lVar4;
    }
    else {
      if (local_40 == 0x4255) {
        if ((long)local_48 < 1) {
          bVar1 = false;
          unaff_RBX = -2;
          goto LAB_00129925;
        }
        if (local_48 < 0x80000001) {
          puVar6 = (uchar *)operator_new__(local_48,(nothrow_t *)&std::nothrow);
        }
        else {
          puVar6 = (uchar *)0x0;
        }
        if (puVar6 == (uchar *)0x0) {
          unaff_RBX = -1;
LAB_0012990c:
          bVar1 = false;
        }
        else {
          iVar3 = (**pReader->_vptr_IMkvReader)(pReader,local_50,uVar2);
          if (iVar3 == 0) {
            if (compression->settings != (uchar *)0x0) {
              operator_delete__(puVar6);
              unaff_RBX = -2;
              goto LAB_0012990c;
            }
            compression->settings = puVar6;
            compression->settings_len = uVar2;
            bVar1 = true;
          }
          else {
            operator_delete__(puVar6);
            bVar1 = false;
            unaff_RBX = 0;
          }
        }
        if (!bVar1) goto LAB_00129923;
      }
      else if (local_40 == 0x4254) {
        uVar5 = UnserializeUInt(pReader,local_50,local_48);
        if ((long)uVar5 < 0) {
          unaff_RBX = -2;
LAB_00129923:
          bVar1 = false;
          goto LAB_00129925;
        }
        compression->algo = uVar5;
        local_38 = CONCAT71((int7)((ulong)id_00 >> 8),1);
      }
      local_50 = local_50 + local_48;
      bVar1 = local_50 <= stop;
      if (stop < local_50) {
        unaff_RBX = -2;
      }
    }
LAB_00129925:
    if (!bVar1) {
      return unaff_RBX;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseCompressionEntry(long long start, long long size,
                                            IMkvReader* pReader,
                                            ContentCompression* compression) {
  assert(pReader);
  assert(compression);

  long long pos = start;
  const long long stop = start + size;

  bool valid = false;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompAlgo) {
      long long algo = UnserializeUInt(pReader, pos, size);
      if (algo < 0)
        return E_FILE_FORMAT_INVALID;
      compression->algo = algo;
      valid = true;
    } else if (id == libwebm::kMkvContentCompSettings) {
      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      // There should be only one settings element per content compression.
      if (compression->settings != NULL) {
        delete[] buf;
        return E_FILE_FORMAT_INVALID;
      }

      compression->settings = buf;
      compression->settings_len = buflen;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  // ContentCompAlgo is mandatory
  if (!valid)
    return E_FILE_FORMAT_INVALID;

  return 0;
}